

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O3

tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> * __thiscall
pstore::command_line::details::record_value_if_available<std::ostream>
          (tuple<pstore::maybe<pstore::command_line::option_*,_void>,_bool> *__return_storage_ptr__,
          details *this,maybe<pstore::command_line::option_*,_void> *handler,
          maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *value,string *program_name,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  undefined1 uVar1;
  int iVar2;
  option **ppoVar3;
  type *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ostream *poVar6;
  string *psVar7;
  details dVar8;
  bool bVar9;
  maybe<pstore::command_line::option_*,_void> local_40;
  
  ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->
                      ((maybe<pstore::command_line::option_*,_void> *)this);
  iVar2 = (*(*ppoVar3)->_vptr_option[0xe])();
  if ((char)iVar2 == '\0') {
    if (handler->valid_ == false) {
      ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->
                          ((maybe<pstore::command_line::option_*,_void> *)this);
      iVar2 = (*(*ppoVar3)->_vptr_option[0x10])();
      uVar1 = (undefined1)iVar2;
      dVar8 = *this;
      if (dVar8 == (details)0x1) goto LAB_00109af7;
    }
    else {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)program_name,*(char **)value,(long)(value->storage_).__align);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Argument \'",0xc);
      ppoVar3 = maybe<pstore::command_line::option_*,_void>::operator->
                          ((maybe<pstore::command_line::option_*,_void> *)this);
      psVar7 = option::name_abi_cxx11_(*ppoVar3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' does not take a value\n",0x18);
      dVar8 = *this;
      uVar1 = false;
    }
  }
  else {
    dVar8 = *this;
    uVar1 = true;
    if (handler->valid_ != false) {
      local_40.valid_ = false;
      bVar9 = ((byte)dVar8 & 1) != 0;
      if (bVar9) {
        ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->
                                   ((maybe<pstore::command_line::option_*,_void> *)this);
        local_40.storage_ = *ptVar4;
      }
      local_40.valid_ = bVar9;
      pbVar5 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               ::operator->((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                             *)handler);
      uVar1 = handler_set_value(&local_40,pbVar5);
      if (local_40.valid_ == true) {
        local_40.valid_ = false;
      }
      if (!(bool)uVar1) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)program_name,*(char **)value,(long)(value->storage_).__align)
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": Unknown value \'",0x11);
        pbVar5 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 ::operator->((maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                               *)handler);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
      }
      if (*this != (details)0x0) {
LAB_00109af7:
        *this = (details)0x0;
        (__return_storage_ptr__->
        super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
        super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = (bool)uVar1;
        (__return_storage_ptr__->
        super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
        super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>.
        _M_head_impl.valid_ = false;
        return __return_storage_ptr__;
      }
      dVar8 = (details)0x0;
    }
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl = (bool)uVar1;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
  super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
  valid_ = false;
  if (((byte)dVar8 & 1) != 0) {
    ptVar4 = (type *)maybe<pstore::command_line::option_*,_void>::operator->
                               ((maybe<pstore::command_line::option_*,_void> *)this);
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    storage_ = *ptVar4;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_bool>).
    super__Head_base<0UL,_pstore::maybe<pstore::command_line::option_*,_void>,_false>._M_head_impl.
    valid_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

auto record_value_if_available (maybe<option *> handler,
                                            maybe<std::string> const & value,
                                            std::string const & program_name, ErrorStream & errs)
                -> std::tuple<maybe<option *>, bool> {
                using str = stream_trait<typename ErrorStream::char_type>;
                bool ok = true;
                if ((*handler)->takes_argument ()) {
                    if (value) {
                        if (!handler_set_value (handler, *value)) {
                            errs << str::out_string (program_name)
                                 << str::out_text (": Unknown value '") << str::out_string (*value)
                                 << str::out_text ("'");
                            ok = false;
                        }
                        handler.reset ();
                    } else {
                        // The option takes an argument but we haven't yet seen the value
                        // string.
                    }
                } else {
                    if (value) {
                        // We got a value but don't want one.
                        errs << str::out_string (program_name) << str::out_text (": Argument '")
                             << str::out_string ((*handler)->name ())
                             << str::out_text ("' does not take a value\n");
                        ok = false;
                    } else {
                        ok = (*handler)->add_occurrence ();
                        handler.reset ();
                    }
                }
                return std::make_tuple (std::move (handler), ok);
            }